

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void deleteInstanceChildren(UA_Server *server,UA_NodeId *objectNodeId)

{
  UA_NodeId *pUVar1;
  UA_ReferenceDescription *rd;
  size_t i;
  UA_BrowseResult bRes;
  UA_BrowseDescription bDes;
  UA_NodeId *objectNodeId_local;
  UA_Server *server_local;
  
  UA_BrowseDescription_init((UA_BrowseDescription *)&bRes.references);
  bRes.references = *(UA_ReferenceDescription **)objectNodeId;
  UA_Server_browse((UA_BrowseResult *)&i,server,0,(UA_BrowseDescription *)&bRes.references);
  for (rd = (UA_ReferenceDescription *)0x0; rd < bRes.continuationPoint.data;
      rd = (UA_ReferenceDescription *)((long)&(rd->referenceTypeId).namespaceIndex + 1)) {
    pUVar1 = (UA_NodeId *)(bRes.referencesSize + (long)rd * 0xc0);
    if ((*(int *)((long)&pUVar1[5].identifier + 8) == 1) ||
       (*(int *)((long)&pUVar1[5].identifier + 8) == 2)) {
      UA_Server_deleteNode(server,*(UA_NodeId *)&pUVar1[1].identifier,true);
    }
    else if (*(int *)((long)&pUVar1[5].identifier + 8) == 4) {
      UA_Server_deleteReference
                (server,*objectNodeId,*pUVar1,true,*(UA_ExpandedNodeId *)&pUVar1[1].identifier,true)
      ;
    }
  }
  UA_BrowseResult_deleteMembers((UA_BrowseResult *)&i);
  return;
}

Assistant:

static void
deleteInstanceChildren(UA_Server *server, UA_NodeId *objectNodeId) {
    /* Browse for children */
    UA_BrowseDescription bDes;
    UA_BrowseDescription_init(&bDes);
    bDes.nodeId = *objectNodeId;
    bDes.browseDirection = UA_BROWSEDIRECTION_FORWARD;
    bDes.nodeClassMask = UA_NODECLASS_OBJECT | UA_NODECLASS_VARIABLE | UA_NODECLASS_METHOD;
    bDes.resultMask = UA_BROWSERESULTMASK_ISFORWARD | UA_BROWSERESULTMASK_NODECLASS | UA_BROWSERESULTMASK_REFERENCETYPEINFO;
    UA_BrowseResult bRes = UA_Server_browse(server, 0, &bDes);

    /* Delete Children */
    for(size_t i=0; i<bRes.referencesSize; ++i) {
        UA_ReferenceDescription *rd = &bRes.references[i];
        if((rd->nodeClass == UA_NODECLASS_OBJECT || rd->nodeClass == UA_NODECLASS_VARIABLE)) {
            UA_Server_deleteNode(server, rd->nodeId.nodeId, true);
        } else if (rd->nodeClass == UA_NODECLASS_METHOD) {
            UA_Server_deleteReference(server, *objectNodeId, rd->referenceTypeId,
                                      true, rd->nodeId, true);
        }
    }

    UA_BrowseResult_deleteMembers(&bRes); 
}